

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

void __thiscall wasm::Literal::Literal(Literal *this,Type type)

{
  bool bVar1;
  HeapType HVar2;
  Type local_20;
  Type type_local;
  
  (this->type).id = type.id;
  local_20.id = type.id;
  if (type.id < 7) {
    switch(type.id & 0xffffffff) {
    case 0:
    case 1:
      handle_unreachable("Invalid literal type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x32);
    case 2:
    case 4:
      goto switchD_00c40a8d_caseD_2;
    case 3:
    case 5:
      (this->field_0).i64 = 0;
      return;
    case 6:
      goto switchD_00c40a8d_caseD_6;
    default:
      break;
    }
  }
  bVar1 = wasm::Type::isNull(&local_20);
  if (bVar1) {
    if (((local_20.id < 7) || (((uint)local_20.id & 3) != 2)) ||
       (bVar1 = wasm::Type::isExact(&local_20), bVar1)) {
      __assert_fail("type.isNullable() && !type.isExact()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                    ,0x38,"wasm::Literal::Literal(Type)");
    }
switchD_00c40a8d_caseD_6:
    (this->field_0).i64 = 0;
    (this->field_0).func.super_IString.str._M_str = (char *)0x0;
  }
  else {
    if (((local_20.id < 7) || ((local_20.id & 1) != 0)) ||
       ((HVar2 = wasm::Type::getHeapType(&local_20), 0x7c < HVar2.id ||
        (((uint)HVar2.id & 0x7b) != 0x30)))) {
      handle_unreachable("Unexpected literal type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x43);
    }
    if ((local_20.id < 7) || ((local_20.id & 3) != 0)) {
      __assert_fail("type.isNonNullable()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                    ,0x3e,"wasm::Literal::Literal(Type)");
    }
switchD_00c40a8d_caseD_2:
    (this->field_0).i32 = 0;
  }
  return;
}

Assistant:

Literal::Literal(Type type) : type(type) {
  if (type.isBasic()) {
    switch (type.getBasic()) {
      case Type::i32:
      case Type::f32:
        i32 = 0;
        return;
      case Type::i64:
      case Type::f64:
        i64 = 0;
        return;
      case Type::v128:
        memset(&v128, 0, 16);
        return;
      case Type::none:
      case Type::unreachable:
        WASM_UNREACHABLE("Invalid literal type");
        return;
    }
  }

  if (type.isNull()) {
    assert(type.isNullable() && !type.isExact());
    new (&gcData) std::shared_ptr<GCData>();
    return;
  }

  if (type.isRef() && type.getHeapType().isMaybeShared(HeapType::i31)) {
    assert(type.isNonNullable());
    i32 = 0;
    return;
  }

  WASM_UNREACHABLE("Unexpected literal type");
}